

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O2

QLibraryPrivate * __thiscall QFactoryLoader::library(QFactoryLoader *this,QString *key)

{
  const_iterator cVar1;
  QLibraryPrivate *pQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d).cs == CaseInsensitive) {
    QString::toLower_helper((QString *)&local_30,key);
  }
  else {
    local_30.d = (key->d).d;
    local_30.ptr = (key->d).ptr;
    local_30.size = (key->d).size;
    if (local_30.d != (Data *)0x0) {
      LOCK();
      ((local_30.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_30.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  cVar1 = std::
          _Rb_tree<QString,_std::pair<const_QString,_QLibraryPrivate_*>,_std::_Select1st<std::pair<const_QString,_QLibraryPrivate_*>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QLibraryPrivate_*>_>_>
          ::find(&(this->d).keyMap._M_t,(key_type *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->d).keyMap._M_t._M_impl.super__Rb_tree_header) {
    pQVar2 = (QLibraryPrivate *)0x0;
  }
  else {
    pQVar2 = (QLibraryPrivate *)cVar1._M_node[1]._M_right;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QLibraryPrivate *QFactoryLoader::library(const QString &key) const
{
    const auto it = d->keyMap.find(d->cs ? key : key.toLower());
    if (it == d->keyMap.cend())
        return nullptr;
    return it->second;
}